

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EntityIdentifier.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::LE_EntityIdentifier::Encode(LE_EntityIdentifier *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8SiteID);
  KDataStream::Write(stream,this->m_ui8ApplicationID);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EntityID);
  return;
}

Assistant:

void LE_EntityIdentifier::Encode( KDataStream & stream ) const
{
    stream << m_ui8SiteID
           << m_ui8ApplicationID
           << m_ui16EntityID;
}